

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_csharp.cpp
# Opt level: O2

void __thiscall
flatbuffers::csharp::CSharpGenerator::GenUnionUnPack_ObjectAPI
          (CSharpGenerator *this,EnumDef *enum_def,string *code_ptr,string *camel_name,
          string *camel_name_short,bool is_vector)

{
  EnumVal *__rhs;
  undefined4 uVar1;
  __type _Var2;
  pointer ppEVar3;
  Type *type;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  undefined3 in_register_00000089;
  string indent;
  string varialbe_name;
  string func_suffix;
  string type_suffix;
  string class_member;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  string *local_158;
  CSharpGenerator *local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  undefined4 local_124;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  EnumDef *local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  pointer local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_158 = camel_name;
  local_150 = this;
  std::operator+(&local_b8,"_o.",camel_name);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_50,"Value",(allocator<char> *)&local_70);
  _Var2 = std::operator==(&local_50,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          enum_def);
  if (_Var2) {
    std::__cxx11::string::append((char *)&local_50);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"",(allocator<char> *)&local_90);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"()",(allocator<char> *)&local_100);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_100,"    ",(allocator<char> *)&local_1b8);
  if (is_vector) {
    std::operator+(&local_1b8,"_o_",local_158);
    std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::assign((char *)&local_70);
    std::__cxx11::string::assign((char *)&local_90);
    std::__cxx11::string::assign((char *)&local_100);
    std::operator+(&local_148,&local_100,"var ");
    std::operator+(&local_198,&local_148,&local_b8);
    std::operator+(&local_1b8,&local_198," = new ");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    pbVar4 = &local_148;
  }
  else {
    std::operator+(&local_198,&local_100,&local_b8);
    std::operator+(&local_1b8,&local_198," = new ");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_1b8);
    pbVar4 = &local_198;
  }
  std::__cxx11::string::~string((string *)pbVar4);
  NamespacedName_abi_cxx11_(&local_198,local_150,&enum_def->super_Definition);
  std::operator+(&local_1b8,&local_198,"Union();\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::operator+(&local_d8,&local_100,&local_b8);
  std::operator+(&local_120,&local_d8,".Type = this.");
  std::operator+(&local_178,&local_120,camel_name_short);
  std::operator+(&local_148,&local_178,"Type");
  std::operator+(&local_198,&local_148,&local_70);
  std::operator+(&local_1b8,&local_198,";\n");
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_d8);
  std::operator+(&local_120,&local_100,"switch (this.");
  std::operator+(&local_178,&local_120,camel_name_short);
  std::operator+(&local_148,&local_178,"Type");
  std::operator+(&local_198,&local_148,&local_70);
  std::operator+(&local_1b8,&local_198,") {\n");
  local_124 = CONCAT31(in_register_00000089,is_vector);
  std::__cxx11::string::append((string *)code_ptr);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_120);
  ppEVar3 = (enum_def->vals).vec.
            super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  local_e0 = enum_def;
  while (ppEVar3 !=
         (local_e0->vals).vec.
         super__Vector_base<flatbuffers::EnumVal_*,_std::allocator<flatbuffers::EnumVal_*>_>._M_impl
         .super__Vector_impl_data._M_finish) {
    __rhs = *ppEVar3;
    local_98 = ppEVar3;
    if ((__rhs->union_type).base_type == BASE_TYPE_NONE) {
      std::operator+(&local_1b8,&local_100,"  default: break;\n");
      std::__cxx11::string::append((string *)code_ptr);
    }
    else {
      std::operator+(&local_120,&local_100,"  case ");
      NamespacedName_abi_cxx11_(&local_d8,local_150,&local_e0->super_Definition);
      std::operator+(&local_178,&local_120,&local_d8);
      std::operator+(&local_148,&local_178,".");
      std::operator+(&local_198,&local_148,&__rhs->name);
      std::operator+(&local_1b8,&local_198,":\n");
      std::__cxx11::string::append((string *)code_ptr);
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_120);
      std::operator+(&local_d8,&local_100,"    ");
      std::operator+(&local_120,&local_d8,&local_b8);
      std::operator+(&local_178,&local_120,".");
      std::operator+(&local_148,&local_178,&local_50);
      std::operator+(&local_198,&local_148," = this.");
      std::operator+(&local_1b8,&local_198,local_158);
      std::__cxx11::string::append((string *)code_ptr);
      type = &__rhs->union_type;
      std::__cxx11::string::~string((string *)&local_1b8);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_120);
      std::__cxx11::string::~string((string *)&local_d8);
      if (type->base_type == BASE_TYPE_STRING) {
        std::operator+(&local_198,"AsString",&local_90);
        std::operator+(&local_1b8,&local_198,";\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_1b8);
        pbVar4 = &local_198;
      }
      else {
        GenTypeGet_abi_cxx11_(&local_178,local_150,type);
        std::operator+(&local_148,"<",&local_178);
        std::operator+(&local_198,&local_148,">");
        std::operator+(&local_1b8,&local_198,&local_90);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_178);
        std::operator+(&local_1b8,".HasValue ? this.",local_158);
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_1b8);
        GenTypeGet_abi_cxx11_(&local_120,local_150,type);
        std::operator+(&local_178,"<",&local_120);
        std::operator+(&local_148,&local_178,">");
        std::operator+(&local_198,&local_148,&local_90);
        std::operator+(&local_1b8,&local_198,".Value.UnPack() : null;\n");
        std::__cxx11::string::append((string *)code_ptr);
        std::__cxx11::string::~string((string *)&local_1b8);
        std::__cxx11::string::~string((string *)&local_198);
        std::__cxx11::string::~string((string *)&local_148);
        std::__cxx11::string::~string((string *)&local_178);
        pbVar4 = &local_120;
      }
      std::__cxx11::string::~string((string *)pbVar4);
      std::operator+(&local_1b8,&local_100,"    break;\n");
      std::__cxx11::string::append((string *)code_ptr);
    }
    std::__cxx11::string::~string((string *)&local_1b8);
    ppEVar3 = local_98 + 1;
  }
  std::operator+(&local_1b8,&local_100,"}\n");
  std::__cxx11::string::append((string *)code_ptr);
  uVar1 = local_124;
  std::__cxx11::string::~string((string *)&local_1b8);
  if ((char)uVar1 != '\0') {
    std::operator+(&local_120,&local_100,"_o.");
    std::operator+(&local_178,&local_120,local_158);
    std::operator+(&local_148,&local_178,".Add(");
    std::operator+(&local_198,&local_148,&local_b8);
    std::operator+(&local_1b8,&local_198,");\n");
    std::__cxx11::string::append((string *)code_ptr);
    std::__cxx11::string::~string((string *)&local_1b8);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_120);
  }
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_b8);
  return;
}

Assistant:

void GenUnionUnPack_ObjectAPI(const EnumDef &enum_def, std::string *code_ptr,
                                const std::string &camel_name,
                                const std::string &camel_name_short,
                                bool is_vector) const {
    auto &code = *code_ptr;
    std::string varialbe_name = "_o." + camel_name;
    std::string class_member = "Value";
    if (class_member == enum_def.name) class_member += "_";
    std::string type_suffix = "";
    std::string func_suffix = "()";
    std::string indent = "    ";
    if (is_vector) {
      varialbe_name = "_o_" + camel_name;
      type_suffix = "(_j)";
      func_suffix = "(_j)";
      indent = "      ";
    }
    if (is_vector) {
      code += indent + "var " + varialbe_name + " = new ";
    } else {
      code += indent + varialbe_name + " = new ";
    }
    code += NamespacedName(enum_def) + "Union();\n";
    code += indent + varialbe_name + ".Type = this." + camel_name_short +
            "Type" + type_suffix + ";\n";
    code += indent + "switch (this." + camel_name_short + "Type" + type_suffix +
            ") {\n";
    for (auto eit = enum_def.Vals().begin(); eit != enum_def.Vals().end();
         ++eit) {
      auto &ev = **eit;
      if (ev.union_type.base_type == BASE_TYPE_NONE) {
        code += indent + "  default: break;\n";
      } else {
        code += indent + "  case " + NamespacedName(enum_def) + "." + ev.name +
                ":\n";
        code += indent + "    " + varialbe_name + "." + class_member +
                " = this." + camel_name;
        if (IsString(ev.union_type)) {
          code += "AsString" + func_suffix + ";\n";
        } else {
          code += "<" + GenTypeGet(ev.union_type) + ">" + func_suffix;
          code += ".HasValue ? this." + camel_name;
          code += "<" + GenTypeGet(ev.union_type) + ">" + func_suffix +
                  ".Value.UnPack() : null;\n";
        }
        code += indent + "    break;\n";
      }
    }
    code += indent + "}\n";
    if (is_vector) {
      code += indent + "_o." + camel_name + ".Add(" + varialbe_name + ");\n";
    }
  }